

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O1

void __thiscall
prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *this,iterator pos,size_type count,
          uchar *value)

{
  char *pcVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = this->_size;
  iVar7 = (int)*(undefined8 *)&this->_union;
  uVar3 = uVar4 - 0x1d;
  if (uVar4 < 0x1d) {
    iVar7 = (int)this;
    uVar3 = uVar4;
  }
  uVar5 = 0x1c;
  if (uVar4 >= 0x1d) {
    uVar5 = (this->_union).indirect_contents.capacity;
  }
  iVar7 = (int)pos.ptr - iVar7;
  uVar3 = uVar3 + count;
  if (uVar5 < uVar3) {
    change_capacity(this,(uVar3 >> 1) + uVar3);
  }
  uVar4 = this->_size;
  lVar8 = (long)iVar7;
  pcVar1 = (char *)((long)&this->_union + lVar8);
  pcVar6 = (this->_union).indirect_contents.indirect + lVar8;
  if (uVar4 < 0x1d) {
    pcVar6 = pcVar1;
  }
  uVar3 = uVar4 - 0x1d;
  if (uVar4 < 0x1d) {
    uVar3 = uVar4;
  }
  memmove(pcVar6 + count,pcVar6,(ulong)(uVar3 - iVar7));
  uVar4 = this->_size + count;
  this->_size = uVar4;
  if (count == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
  }
  else {
    pcVar6 = (this->_union).indirect_contents.indirect + lVar8;
    if (uVar4 < 0x1d) {
      pcVar6 = pcVar1;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      memset(pcVar6,(uint)*value,(ulong)count);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void insert(iterator pos, size_type count, const T& value) {
        size_type p = pos - begin();
        size_type new_size = size() + count;
        if (capacity() < new_size) {
            change_capacity(new_size + (new_size >> 1));
        }
        T* ptr = item_ptr(p);
        T* dst = ptr + count;
        memmove(dst, ptr, (size() - p) * sizeof(T));
        _size += count;
        fill(item_ptr(p), count, value);
    }